

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O1

string * to_utf8_string(string *__return_storage_ptr__,wstring *wstr)

{
  wchar_t *__first;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  wStack_78;
  
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert(&wStack_78);
  __first = (wstr->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,&wStack_78,__first,__first + wstr->_M_string_length);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert(&wStack_78);
  return __return_storage_ptr__;
}

Assistant:

std::string to_utf8_string(std::wstring const& wstr){ return std::wstring_convert<std::codecvt_utf8<wchar_t>>{}.to_bytes(wstr); }